

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
interfaces::MakeCleanupHandler(interfaces *this,function<void_()> cleanup)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  _Any_data local_48;
  long local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  puVar2 = (undefined8 *)operator_new(0x28);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = 0;
  uStack_30 = in_RSI[3];
  lVar1 = in_RSI[2];
  if (lVar1 != 0) {
    local_48._M_unused._0_8_ = (undefined8)*in_RSI;
    local_48._8_8_ = in_RSI[1];
    in_RSI[2] = 0;
    in_RSI[3] = 0;
    local_38 = lVar1;
  }
  puVar2[3] = 0;
  *puVar2 = &PTR__CleanupHandler_01149710;
  puVar2[1] = 0;
  puVar2[2] = 0;
  puVar2[4] = uStack_30;
  if (lVar1 != 0) {
    puVar2[1] = local_48._M_unused._M_object;
    puVar2[2] = local_48._8_8_;
    puVar2[3] = lVar1;
    local_38 = 0;
    uStack_30 = 0;
  }
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  *(undefined8 **)this = puVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> MakeCleanupHandler(std::function<void()> cleanup)
{
    return std::make_unique<common::CleanupHandler>(std::move(cleanup));
}